

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGeometry.h
# Opt level: O2

ChMatrix33<double> *
chrono::utils::CalcRoundedCylinderGyration
          (ChMatrix33<double> *__return_storage_ptr__,double radius,double hlen,double srad,
          ChVector<double> *pos,ChQuaternion<double> *rot)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar1 = radius + srad;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)__return_storage_ptr__);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1 * 3.0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (hlen + srad) * (hlen + srad) * 4.0;
  auVar3 = vfmadd231sd_fma(auVar4,auVar5,auVar3);
  dVar2 = auVar3._0_8_ * 0.08333333333333333;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar2;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       dVar1 * dVar1 * 0.5;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

inline ChMatrix33<> CalcRoundedCylinderGyration(double radius,
                                                double hlen,
                                                double srad,
                                                const ChVector<>& pos = ChVector<>(0, 0, 0),
                                                const ChQuaternion<>& rot = ChQuaternion<>(1, 0, 0, 0)) {
    double modifiedRadius = radius + srad;
    double modifiedHlen = hlen + srad;

    ChMatrix33<> J;
    J.setZero();
    //// TODO: for now, use the gyration of the offset cylinder
    J(0, 0) = (1.0 / 12.0) * (3 * modifiedRadius * modifiedRadius + 4 * modifiedHlen * modifiedHlen);
    J(1, 1) = (1.0 / 2.0) * (modifiedRadius * modifiedRadius);
    J(2, 2) = (1.0 / 12.0) * (3 * modifiedRadius * modifiedRadius + 4 * modifiedHlen * modifiedHlen);

    TransformGyration(J, pos, rot);

    return J;
}